

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

TestRegistry * TestRegistry::getCurrentRegistry(void)

{
  int iVar1;
  TestRegistry *local_20;
  
  if (getCurrentRegistry()::registry == '\0') {
    iVar1 = __cxa_guard_acquire(&getCurrentRegistry()::registry);
    if (iVar1 != 0) {
      TestRegistry(&getCurrentRegistry::registry);
      __cxa_atexit(~TestRegistry,&getCurrentRegistry::registry,&__dso_handle);
      __cxa_guard_release(&getCurrentRegistry()::registry);
    }
  }
  if (currentRegistry_ == (TestRegistry *)0x0) {
    local_20 = &getCurrentRegistry::registry;
  }
  else {
    local_20 = currentRegistry_;
  }
  return local_20;
}

Assistant:

TestRegistry* TestRegistry::getCurrentRegistry()
{
    static TestRegistry registry;
    return (currentRegistry_ == NULLPTR) ? &registry : currentRegistry_;
}